

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

bool __thiscall t_swift_generator::field_is_optional(t_swift_generator *this,t_field *tfield)

{
  bool bVar1;
  e_req eVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  bool bVar3;
  _Self local_68 [3];
  allocator local_49;
  key_type local_48;
  _Self local_28;
  byte local_19;
  t_field *ptStack_18;
  bool opt;
  t_field *tfield_local;
  t_swift_generator *this_local;
  
  ptStack_18 = tfield;
  tfield_local = (t_field *)this;
  eVar2 = t_field::get_req(tfield);
  local_19 = eVar2 == T_OPTIONAL;
  this_00 = &ptStack_18->annotations_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"swift.nullable",&local_49);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(this_00,&local_48);
  local_68[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&ptStack_18->annotations_);
  bVar1 = std::operator!=(&local_28,local_68);
  bVar3 = false;
  if (bVar1) {
    eVar2 = t_field::get_req(ptStack_18);
    bVar3 = eVar2 != T_REQUIRED;
  }
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (bVar3) {
    local_19 = 1;
  }
  if ((this->gen_cocoa_ & 1U) != 0) {
    eVar2 = t_field::get_req(ptStack_18);
    local_19 = eVar2 == T_OPTIONAL;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool field_is_optional(t_field* tfield) {
    bool opt = tfield->get_req() == t_field::T_OPTIONAL;
    if (tfield->annotations_.find("swift.nullable") != tfield->annotations_.end() && tfield->get_req() != t_field::T_REQUIRED) {
      opt = true;
    }
    if (gen_cocoa_) { // Backwards compatibility, only if its actually "optional"
      opt = tfield->get_req() == t_field::T_OPTIONAL;
    }
    return opt;
  }